

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

uint __thiscall
Js::SourceTextModuleRecord::GetLocalExportSlotIndexByExportName
          (SourceTextModuleRecord *this,PropertyId exportNameId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyId local_20;
  uint local_1c;
  PropertyId exportNameId_local;
  uint slotIndex;
  
  local_20 = exportNameId;
  if (this->localSlotCount == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x5cd,"(localSlotCount != 0)","localSlotCount != 0");
    if (!bVar2) goto LAB_009eace9;
    *puVar3 = 0;
  }
  if ((this->localExportSlots).ptr == (WriteBarrierPtr<void> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x5ce,"(localExportSlots != nullptr)","localExportSlots != nullptr"
                               );
    if (!bVar2) goto LAB_009eace9;
    *puVar3 = 0;
  }
  local_1c = 0xffffffff;
  bVar2 = JsUtil::
          BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<int>((this->localExportMapByExportName).ptr,&local_20,&local_1c);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x5d2,"(false)","exportNameId is not in local export list");
    if (!bVar2) {
LAB_009eace9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    local_1c = 0xffffffff;
  }
  return local_1c;
}

Assistant:

uint SourceTextModuleRecord::GetLocalExportSlotIndexByExportName(PropertyId exportNameId)
    {
        Assert(localSlotCount != 0);
        Assert(localExportSlots != nullptr);
        uint slotIndex = InvalidSlotIndex;
        if (!localExportMapByExportName->TryGetValue(exportNameId, &slotIndex))
        {
            AssertMsg(false, "exportNameId is not in local export list");
            return InvalidSlotIndex;
        }
        else
        {
            return slotIndex;
        }
    }